

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void lua_setfield(lua_State *L,int idx,char *k)

{
  TValue *str;
  lua_State *in_RDX;
  int in_ESI;
  lua_State *in_RDI;
  TValue *i_o;
  TValue key;
  StkId t;
  size_t in_stack_ffffffffffffffd8;
  
  str = index2adr(in_RDI,in_ESI);
  strlen((char *)in_RDX);
  luaS_newlstr(in_RDX,(char *)str,in_stack_ffffffffffffffd8);
  luaV_settable((lua_State *)k,t,(TValue *)key._8_8_,(StkId)key.value.gc);
  in_RDI->top = in_RDI->top + -1;
  return;
}

Assistant:

static void lua_setfield(lua_State*L,int idx,const char*k){
StkId t;
TValue key;
api_checknelems(L,1);
t=index2adr(L,idx);
api_checkvalidindex(L,t);
setsvalue(L,&key,luaS_new(L,k));
luaV_settable(L,t,&key,L->top-1);
L->top--;
}